

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000170570 = 0x2d2d2d2d2d2d2d;
    uRam0000000000170577 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00170560 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000170568 = 0x2d2d2d2d2d2d2d;
    DAT_0017056f = 0x2d;
    _DAT_00170550 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000170558 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00170540 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000170548 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000170538 = 0x2d2d2d2d2d2d2d2d;
    DAT_0017057f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }